

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_quote(connectdata *conn,_Bool init,ftpstate instate)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  Curl_easy *data;
  void *pvVar1;
  CURLcode CVar2;
  long lVar3;
  undefined8 *puVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  bool bVar8;
  
  data = conn->data;
  lVar3 = 0x3a8;
  if (instate - FTP_RETR_PREQUOTE < 3) {
    lVar3 = *(long *)(&DAT_001420f8 + (ulong)(instate - FTP_RETR_PREQUOTE) * 8);
  }
  puVar4 = *(undefined8 **)((long)data->sockets + lVar3 + -0x80);
  iVar5 = 0;
  if (!init) {
    iVar5 = (conn->proto).ftpc.count1 + 1;
  }
  pvVar1 = (data->req).protop;
  pp = &conn->proto;
  (conn->proto).ftpc.count1 = iVar5;
  if (puVar4 != (undefined8 *)0x0) {
    iVar7 = 0;
    for (; (iVar7 < iVar5 && (puVar4 != (undefined8 *)0x0)); puVar4 = (undefined8 *)puVar4[1]) {
      iVar7 = iVar7 + 1;
    }
    if (puVar4 != (undefined8 *)0x0) {
      pcVar6 = (char *)*puVar4;
      bVar8 = *pcVar6 == '*';
      *(uint *)((long)&conn->proto + 0xa8) = (uint)bVar8;
      CVar2 = Curl_pp_sendf(&(pp->ftpc).pp,"%s",pcVar6 + bVar8);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      (conn->proto).ftpc.state = instate;
      return CURLE_OK;
    }
  }
  if (instate == FTP_RETR_PREQUOTE) {
    if (*(int *)((long)pvVar1 + 0x18) == 0) {
      lVar3 = (conn->proto).ftpc.known_filesize;
      if (lVar3 != -1) {
        Curl_pgrsSetDownloadSize(data,lVar3);
        CVar2 = ftp_state_retr(conn,(conn->proto).ftpc.known_filesize);
        return CVar2;
      }
      pcVar6 = (conn->proto).ftpc.file;
      if ((data->set).ignorecl == true) {
        CVar2 = Curl_pp_sendf(&(pp->ftpc).pp,"RETR %s",pcVar6);
        if (CVar2 == CURLE_OK) {
          (conn->proto).ftpc.state = FTP_RETR;
          CVar2 = CURLE_OK;
        }
      }
      else {
        CVar2 = Curl_pp_sendf(&(pp->ftpc).pp,"SIZE %s",pcVar6);
        if (CVar2 == CURLE_OK) {
          (conn->proto).ftpc.state = FTP_RETR_SIZE;
          CVar2 = CURLE_OK;
        }
      }
    }
    else {
      (conn->proto).ftpc.state = FTP_STOP;
      CVar2 = CURLE_OK;
    }
  }
  else {
    if (instate == FTP_STOR_PREQUOTE) {
      CVar2 = ftp_state_ul_setup(conn,false);
      return CVar2;
    }
    CVar2 = CURLE_OK;
    if (instate != FTP_POSTQUOTE) {
      if ((conn->proto).ftpc.cwddone == true) {
LAB_00136dc1:
        CVar2 = ftp_state_mdtm(conn);
        return CVar2;
      }
      (conn->proto).ftpc.count2 = 0;
      *(uint *)((long)&conn->proto + 0xac) = (uint)((data->set).ftp_create_missing_dirs == 2);
      if (((conn->bits).reuse == true) &&
         (pcVar6 = (conn->proto).ftpc.entrypath, pcVar6 != (char *)0x0)) {
        (conn->proto).ftpc.count1 = 0;
      }
      else {
        if ((conn->proto).ftpc.dirdepth == 0) goto LAB_00136dc1;
        (conn->proto).ftpc.count1 = 1;
        pcVar6 = *(conn->proto).ftpc.dirs;
      }
      CVar2 = Curl_pp_sendf(&(pp->ftpc).pp,"CWD %s",pcVar6);
      if (CVar2 == CURLE_OK) {
        (conn->proto).ftpc.state = FTP_CWD;
        CVar2 = CURLE_OK;
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_quote(struct connectdata *conn,
                                bool init,
                                ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool quote=FALSE;
  struct curl_slist *item;

  switch(instate) {
  case FTP_QUOTE:
  default:
    item = data->set.quote;
    break;
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
    item = data->set.prequote;
    break;
  case FTP_POSTQUOTE:
    item = data->set.postquote;
    break;
  }

  /*
   * This state uses:
   * 'count1' to iterate over the commands to send
   * 'count2' to store whether to allow commands to fail
   */

  if(init)
    ftpc->count1 = 0;
  else
    ftpc->count1++;

  if(item) {
    int i = 0;

    /* Skip count1 items in the linked list */
    while((i< ftpc->count1) && item) {
      item = item->next;
      i++;
    }
    if(item) {
      char *cmd = item->data;
      if(cmd[0] == '*') {
        cmd++;
        ftpc->count2 = 1; /* the sent command is allowed to fail */
      }
      else
        ftpc->count2 = 0; /* failure means cancel operation */

      PPSENDF(&ftpc->pp, "%s", cmd);
      state(conn, instate);
      quote = TRUE;
    }
  }

  if(!quote) {
    /* No more quote to send, continue to ... */
    switch(instate) {
    case FTP_QUOTE:
    default:
      result = ftp_state_cwd(conn);
      break;
    case FTP_RETR_PREQUOTE:
      if(ftp->transfer != FTPTRANSFER_BODY)
        state(conn, FTP_STOP);
      else {
        if(ftpc->known_filesize != -1) {
          Curl_pgrsSetDownloadSize(data, ftpc->known_filesize);
          result = ftp_state_retr(conn, ftpc->known_filesize);
        }
        else {
          if(data->set.ignorecl) {
            /* This code is to support download of growing files.  It prevents
               the state machine from requesting the file size from the
               server.  With an unknown file size the download continues until
               the server terminates it, otherwise the client stops if the
               received byte count exceeds the reported file size.  Set option
               CURLOPT_IGNORE_CONTENT_LENGTH to 1 to enable this behavior.*/
            PPSENDF(&ftpc->pp, "RETR %s", ftpc->file);
            state(conn, FTP_RETR);
          }
          else {
            PPSENDF(&ftpc->pp, "SIZE %s", ftpc->file);
            state(conn, FTP_RETR_SIZE);
          }
        }
      }
      break;
    case FTP_STOR_PREQUOTE:
      result = ftp_state_ul_setup(conn, FALSE);
      break;
    case FTP_POSTQUOTE:
      break;
    }
  }

  return result;
}